

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_enc.cc
# Opt level: O1

int asn1_ex_i2c(ASN1_VALUE **pval,uchar *cont,int *putype,ASN1_ITEM *it)

{
  char cVar1;
  ASN1_VALUE *pAVar2;
  int iVar3;
  int iVar4;
  char *__src;
  uchar **ppuVar5;
  int iVar6;
  char *in_R8;
  uchar c;
  char local_39;
  uchar *local_38;
  
  cVar1 = *in_R8;
  local_38 = cont;
  if ((cVar1 != '\0') && (cVar1 != '\x05')) {
    __assert_fail("it->itype == ASN1_ITYPE_PRIMITIVE || it->itype == ASN1_ITYPE_MSTRING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0x212,
                  "int asn1_ex_i2c(ASN1_VALUE **, unsigned char *, int *, int *, const ASN1_ITEM *)"
                 );
  }
  if (*(long *)(in_R8 + 0x18) != 0) {
    __assert_fail("it->funcs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0x215,
                  "int asn1_ex_i2c(ASN1_VALUE **, unsigned char *, int *, int *, const ASN1_ITEM *)"
                 );
  }
  *putype = 0;
  if (((cVar1 != '\0') || (*(int *)(in_R8 + 4) != 1)) && (*pval == (ASN1_VALUE *)0x0))
  goto LAB_0022a418;
  if (cVar1 == '\x05') {
LAB_0022a28c:
    iVar6 = *(int *)(*pval + 4);
    if (iVar6 != -3 && iVar6 < 0) {
      iVar3 = 0xbf;
      iVar6 = 0x228;
      goto LAB_0022a2bc;
    }
    iVar4 = 10;
    if (iVar6 != 0x10a) {
      iVar4 = iVar6;
    }
    iVar3 = 2;
    if (iVar6 != 0x102) {
      iVar3 = iVar4;
    }
    *(int *)it = iVar3;
  }
  else if (*(int *)(in_R8 + 4) == -4) {
    pAVar2 = *pval;
    iVar3 = *(int *)pAVar2;
    if (iVar3 != -3 && iVar3 < 0) {
      ERR_put_error(0xc,0,0xbf,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                    ,0x23a);
      return -1;
    }
    *(int *)it = iVar3;
    pval = (ASN1_VALUE **)(pAVar2 + 8);
  }
  else {
    if (*(int *)(in_R8 + 4) == -5) goto LAB_0022a28c;
    iVar3 = *(int *)it;
  }
  switch(iVar3) {
  case 1:
    iVar3 = *(int *)pval;
    if (iVar3 == -1) goto LAB_0022a418;
    if (*(int *)(in_R8 + 4) != -4) {
      if (iVar3 != 0) {
        if (0 < *(long *)(in_R8 + 0x20)) goto LAB_0022a418;
        if (iVar3 != 0) goto LAB_0022a401;
      }
      if (*(long *)(in_R8 + 0x20) == 0) {
LAB_0022a418:
        *putype = 1;
        return 0;
      }
    }
LAB_0022a401:
    local_39 = -(iVar3 != 0);
    __src = &local_39;
    iVar3 = 1;
    break;
  case 2:
  case 10:
    ppuVar5 = &local_38;
    if (cont == (uchar *)0x0) {
      ppuVar5 = (uchar **)0x0;
    }
    iVar3 = i2c_ASN1_INTEGER((ASN1_INTEGER *)*pval,ppuVar5);
    goto LAB_0022a448;
  case 3:
    ppuVar5 = &local_38;
    if (cont == (uchar *)0x0) {
      ppuVar5 = (uchar **)0x0;
    }
    iVar3 = i2c_ASN1_BIT_STRING((ASN1_BIT_STRING *)*pval,ppuVar5);
LAB_0022a448:
    if (0 < iVar3) {
      return iVar3;
    }
    return -1;
  case 5:
    __src = (char *)0x0;
    iVar3 = 0;
    break;
  case 6:
    iVar3 = *(int *)((long)*pval + 0x14);
    if (iVar3 == 0) {
      iVar3 = 0x86;
      iVar6 = 0x24a;
      goto LAB_0022a2bc;
    }
    __src = *(char **)((long)*pval + 0x18);
    break;
  case -3:
  case 4:
  case 0xc:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1e:
    __src = *(char **)((long)*pval + 8);
    iVar3 = *(int *)*pval;
    break;
  default:
    iVar3 = 0xc1;
    iVar6 = 0x28e;
LAB_0022a2bc:
    ERR_put_error(0xc,0,iVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,iVar6);
    return -1;
  }
  if ((cont != (uchar *)0x0) && (iVar3 != 0)) {
    memcpy(cont,__src,(long)iVar3);
  }
  return iVar3;
}

Assistant:

static int asn1_ex_i2c(ASN1_VALUE **pval, unsigned char *cout, int *out_omit,
                       int *putype, const ASN1_ITEM *it) {
  ASN1_BOOLEAN *tbool = NULL;
  ASN1_STRING *strtmp;
  ASN1_OBJECT *otmp;
  int utype;
  const unsigned char *cont;
  unsigned char c;
  int len;

  assert(it->itype == ASN1_ITYPE_PRIMITIVE || it->itype == ASN1_ITYPE_MSTRING);
  // Historically, |it->funcs| for primitive types contained an
  // |ASN1_PRIMITIVE_FUNCS| table of callbacks.
  assert(it->funcs == NULL);

  *out_omit = 0;

  // Handle omitted optional values for all but BOOLEAN, which uses a
  // non-pointer representation.
  if (it->itype != ASN1_ITYPE_PRIMITIVE || it->utype != V_ASN1_BOOLEAN) {
    if (!*pval) {
      *out_omit = 1;
      return 0;
    }
  }

  if (it->itype == ASN1_ITYPE_MSTRING || it->utype == V_ASN1_ANY_AS_STRING) {
    // If MSTRING type set the underlying type
    strtmp = (ASN1_STRING *)*pval;
    utype = strtmp->type;
    if (utype < 0 && utype != V_ASN1_OTHER) {
      // MSTRINGs can have type -1 when default-constructed.
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_WRONG_TYPE);
      return -1;
    }
    // Negative INTEGER and ENUMERATED values use |ASN1_STRING| type values that
    // do not match their corresponding utype values.
    if (utype == V_ASN1_NEG_INTEGER) {
      utype = V_ASN1_INTEGER;
    } else if (utype == V_ASN1_NEG_ENUMERATED) {
      utype = V_ASN1_ENUMERATED;
    }
    *putype = utype;
  } else if (it->utype == V_ASN1_ANY) {
    // If ANY set type and pointer to value
    ASN1_TYPE *typ;
    typ = (ASN1_TYPE *)*pval;
    utype = typ->type;
    if (utype < 0 && utype != V_ASN1_OTHER) {
      // |ASN1_TYPE|s can have type -1 when default-constructed.
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_WRONG_TYPE);
      return -1;
    }
    *putype = utype;
    pval = &typ->value.asn1_value;
  } else {
    utype = *putype;
  }

  switch (utype) {
    case V_ASN1_OBJECT:
      otmp = (ASN1_OBJECT *)*pval;
      cont = otmp->data;
      len = otmp->length;
      if (len == 0) {
        // Some |ASN1_OBJECT|s do not have OIDs and cannot be serialized.
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_OBJECT);
        return -1;
      }
      break;

    case V_ASN1_NULL:
      cont = NULL;
      len = 0;
      break;

    case V_ASN1_BOOLEAN:
      tbool = (ASN1_BOOLEAN *)pval;
      if (*tbool == ASN1_BOOLEAN_NONE) {
        *out_omit = 1;
        return 0;
      }
      if (it->utype != V_ASN1_ANY) {
        // Default handling if value == size field then omit
        if ((*tbool && (it->size > 0)) || (!*tbool && !it->size)) {
          *out_omit = 1;
          return 0;
        }
      }
      c = *tbool ? 0xff : 0x00;
      cont = &c;
      len = 1;
      break;

    case V_ASN1_BIT_STRING: {
      int ret =
          i2c_ASN1_BIT_STRING((ASN1_BIT_STRING *)*pval, cout ? &cout : NULL);
      // |i2c_ASN1_BIT_STRING| returns zero on error instead of -1.
      return ret <= 0 ? -1 : ret;
    }

    case V_ASN1_INTEGER:
    case V_ASN1_ENUMERATED: {
      // |i2c_ASN1_INTEGER| also handles ENUMERATED.
      int ret = i2c_ASN1_INTEGER((ASN1_INTEGER *)*pval, cout ? &cout : NULL);
      // |i2c_ASN1_INTEGER| returns zero on error instead of -1.
      return ret <= 0 ? -1 : ret;
    }

    case V_ASN1_OCTET_STRING:
    case V_ASN1_NUMERICSTRING:
    case V_ASN1_PRINTABLESTRING:
    case V_ASN1_T61STRING:
    case V_ASN1_VIDEOTEXSTRING:
    case V_ASN1_IA5STRING:
    case V_ASN1_UTCTIME:
    case V_ASN1_GENERALIZEDTIME:
    case V_ASN1_GRAPHICSTRING:
    case V_ASN1_VISIBLESTRING:
    case V_ASN1_GENERALSTRING:
    case V_ASN1_UNIVERSALSTRING:
    case V_ASN1_BMPSTRING:
    case V_ASN1_UTF8STRING:
    case V_ASN1_SEQUENCE:
    case V_ASN1_SET:
    // This is not a valid |ASN1_ITEM| type, but it appears in |ASN1_TYPE|.
    case V_ASN1_OTHER:
      // All based on ASN1_STRING and handled the same
      strtmp = (ASN1_STRING *)*pval;
      cont = strtmp->data;
      len = strtmp->length;
      break;

    default:
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
      return -1;
  }
  if (cout && len) {
    OPENSSL_memcpy(cout, cont, len);
  }
  return len;
}